

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O3

void xmlListPopFront(xmlListPtr l)

{
  xmlLinkPtr pxVar1;
  _func_void_xmlLinkPtr *p_Var2;
  _xmlLink *p_Var3;
  _xmlLink *p_Var4;
  
  if ((l != (xmlListPtr)0x0) && (pxVar1 = l->sentinel->next, pxVar1 != l->sentinel)) {
    p_Var2 = l->linkDeallocator;
    p_Var3 = pxVar1->next;
    p_Var4 = pxVar1->prev;
    p_Var4->next = p_Var3;
    p_Var3->prev = p_Var4;
    if (p_Var2 != (_func_void_xmlLinkPtr *)0x0) {
      (*p_Var2)(pxVar1);
    }
    (*xmlFree)(pxVar1);
    return;
  }
  return;
}

Assistant:

void
xmlListPopFront(xmlListPtr l)
{
    if(!xmlListEmpty(l))
        xmlLinkDeallocator(l, l->sentinel->next);
}